

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randunified.cpp
# Opt level: O1

void __thiscall NaRandUnifiedFunc::ddescr_addh(NaRandUnifiedFunc *this,DimDescr *dd)

{
  uint uVar1;
  DimDescr *__src;
  NaReal NVar2;
  NaReal NVar3;
  NaReal NVar4;
  uint uVar5;
  DimDescr *__s;
  
  uVar1 = this->n_ddescr;
  uVar5 = uVar1 + 1;
  this->n_ddescr = uVar5;
  __s = (DimDescr *)operator_new__((ulong)uVar5 * 0x28);
  if (uVar1 != 0xffffffff) {
    memset(__s,0,(((ulong)uVar5 * 0x28 - 0x28) / 0x28) * 0x28 + 0x28);
  }
  if (1 < uVar5) {
    __src = this->ddescr;
    memcpy(__s,__src,(ulong)uVar1 * 0x28);
    if (__src != (DimDescr *)0x0) {
      operator_delete__(__src);
    }
  }
  this->ddescr = __s;
  uVar5 = this->n_ddescr - 1;
  __s[uVar5].Aprev = dd->Aprev;
  NVar2 = dd->Amin;
  NVar3 = dd->Amax;
  NVar4 = dd->Afirst;
  __s[uVar5].Amaxstep = dd->Amaxstep;
  (&__s[uVar5].Amaxstep)[1] = NVar4;
  __s[uVar5].Amin = NVar2;
  __s[uVar5].Amax = NVar3;
  return;
}

Assistant:

void
NaRandUnifiedFunc::ddescr_addh (const DimDescr& dd)
{
	DimDescr	*pNew = new DimDescr[++n_ddescr];
	if(n_ddescr > 1) {
		memcpy(pNew, ddescr, sizeof(DimDescr) * (n_ddescr - 1));
		delete[] ddescr;
	}
	ddescr = pNew;
	ddescr[n_ddescr - 1] = dd;
}